

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_updateCParams_whileCompressing(ZSTDMT_CCtx *mtctx,ZSTD_CCtx_params *cctxParams)

{
  undefined4 uVar1;
  long in_RSI;
  long in_RDI;
  ZSTD_compressionParameters cParams;
  int compressionLevel;
  U32 saved_wlog;
  U64 in_stack_00000038;
  ZSTD_CCtx_params *in_stack_00000040;
  undefined4 uStack_30;
  undefined8 local_2c;
  undefined8 local_24;
  undefined4 local_1c;
  
  uVar1 = *(undefined4 *)(in_RDI + 0x2c);
  *(undefined4 *)(in_RDI + 0x54) = *(undefined4 *)(in_RSI + 0x2c);
  ZSTD_getCParamsFromCCtxParams(in_stack_00000040,in_stack_00000038,(size_t)mtctx,cctxParams._4_4_);
  *(ulong *)(in_RDI + 0x2c) = CONCAT44(uStack_30,uVar1);
  *(undefined8 *)(in_RDI + 0x34) = local_2c;
  *(undefined8 *)(in_RDI + 0x3c) = local_24;
  *(undefined4 *)(in_RDI + 0x44) = local_1c;
  return;
}

Assistant:

void ZSTDMT_updateCParams_whileCompressing(ZSTDMT_CCtx* mtctx, const ZSTD_CCtx_params* cctxParams)
{
    U32 const saved_wlog = mtctx->params.cParams.windowLog;   /* Do not modify windowLog while compressing */
    int const compressionLevel = cctxParams->compressionLevel;
    DEBUGLOG(5, "ZSTDMT_updateCParams_whileCompressing (level:%i)",
                compressionLevel);
    mtctx->params.compressionLevel = compressionLevel;
    {   ZSTD_compressionParameters cParams = ZSTD_getCParamsFromCCtxParams(cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
        cParams.windowLog = saved_wlog;
        mtctx->params.cParams = cParams;
    }
}